

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::ValidateProto3Message
          (DescriptorBuilder *this,Descriptor *message,DescriptorProto *proto)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  DescriptorProto *proto_00;
  EnumDescriptorProto *proto_01;
  FieldDescriptorProto *pFVar5;
  string *psVar6;
  MessageOptions *this_00;
  FieldDescriptor *pFVar7;
  string *psVar8;
  mapped_type *ppFVar9;
  long lVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  _Self local_a8;
  _Self local_a0;
  undefined1 local_98 [8];
  string lowercase_name;
  int local_64;
  undefined1 local_60 [4];
  int i_4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FieldDescriptor_*>_>_>
  name_to_field;
  int i_3;
  int i_2;
  int i_1;
  int i;
  DescriptorProto *proto_local;
  Descriptor *message_local;
  DescriptorBuilder *this_local;
  
  for (i_2 = 0; iVar3 = Descriptor::nested_type_count(message), i_2 < iVar3; i_2 = i_2 + 1) {
    lVar1 = *(long *)(message + 0x50);
    proto_00 = DescriptorProto::nested_type(proto,i_2);
    ValidateProto3Message(this,(Descriptor *)(lVar1 + (long)i_2 * 0xa8),proto_00);
  }
  for (i_3 = 0; iVar3 = Descriptor::enum_type_count(message), i_3 < iVar3; i_3 = i_3 + 1) {
    lVar1 = *(long *)(message + 0x60);
    proto_01 = DescriptorProto::enum_type(proto,i_3);
    ValidateProto3Enum(this,(EnumDescriptor *)(lVar1 + (long)i_3 * 0x38),proto_01);
  }
  for (name_to_field._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
      iVar3 = name_to_field._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,
      iVar4 = Descriptor::field_count(message), iVar3 < iVar4;
      name_to_field._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
           name_to_field._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ + 1) {
    lVar1 = *(long *)(message + 0x30);
    lVar10 = (long)name_to_field._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
    pFVar5 = DescriptorProto::field
                       (proto,name_to_field._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
    ValidateProto3Field(this,(FieldDescriptor *)(lVar1 + lVar10 * 0xa8),pFVar5);
  }
  for (name_to_field._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
      iVar3 = (int)name_to_field._M_t._M_impl.super__Rb_tree_header._M_node_count,
      iVar4 = Descriptor::extension_count(message), iVar3 < iVar4;
      name_to_field._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
           (int)name_to_field._M_t._M_impl.super__Rb_tree_header._M_node_count + 1) {
    lVar1 = *(long *)(message + 0x80);
    lVar10 = (long)(int)name_to_field._M_t._M_impl.super__Rb_tree_header._M_node_count;
    pFVar5 = DescriptorProto::extension
                       (proto,(int)name_to_field._M_t._M_impl.super__Rb_tree_header._M_node_count);
    ValidateProto3Field(this,(FieldDescriptor *)(lVar1 + lVar10 * 0xa8),pFVar5);
  }
  iVar3 = Descriptor::extension_range_count(message);
  if (0 < iVar3) {
    psVar6 = Descriptor::full_name_abi_cxx11_(message);
    AddError(this,psVar6,&proto->super_Message,OTHER,"Extension ranges are not allowed in proto3.");
  }
  this_00 = Descriptor::options(message);
  bVar2 = MessageOptions::message_set_wire_format(this_00);
  if (bVar2) {
    psVar6 = Descriptor::full_name_abi_cxx11_(message);
    AddError(this,psVar6,&proto->super_Message,OTHER,"MessageSet is not supported in proto3.");
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FieldDescriptor_*>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FieldDescriptor_*>_>_>
         *)local_60);
  for (local_64 = 0; iVar3 = Descriptor::field_count(message), local_64 < iVar3;
      local_64 = local_64 + 1) {
    pFVar7 = Descriptor::field(message,local_64);
    psVar6 = FieldDescriptor::name_abi_cxx11_(pFVar7);
    ToLowercaseWithoutUnderscores((string *)local_98,psVar6);
    local_a0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FieldDescriptor_*>_>_>
         ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FieldDescriptor_*>_>_>
                 *)local_60,(key_type *)local_98);
    local_a8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FieldDescriptor_*>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FieldDescriptor_*>_>_>
                *)local_60);
    bVar2 = std::operator!=(&local_a0,&local_a8);
    if (bVar2) {
      psVar6 = Descriptor::full_name_abi_cxx11_(message);
      pFVar7 = Descriptor::field(message,local_64);
      psVar8 = FieldDescriptor::name_abi_cxx11_(pFVar7);
      std::operator+(&local_148,"The JSON camel-case name of field \"",psVar8);
      std::operator+(&local_128,&local_148,"\" conflicts with field \"");
      ppFVar9 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FieldDescriptor_*>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FieldDescriptor_*>_>_>
                              *)local_60,(key_type *)local_98);
      psVar8 = FieldDescriptor::name_abi_cxx11_(*ppFVar9);
      std::operator+(&local_108,&local_128,psVar8);
      std::operator+(&local_e8,&local_108,"\". This is not ");
      std::operator+(&local_c8,&local_e8,"allowed in proto3.");
      AddError(this,psVar6,&proto->super_Message,OTHER,&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_148);
    }
    else {
      pFVar7 = Descriptor::field(message,local_64);
      ppFVar9 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FieldDescriptor_*>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FieldDescriptor_*>_>_>
                              *)local_60,(key_type *)local_98);
      *ppFVar9 = pFVar7;
    }
    std::__cxx11::string::~string((string *)local_98);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FieldDescriptor_*>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FieldDescriptor_*>_>_>
          *)local_60);
  return;
}

Assistant:

void DescriptorBuilder::ValidateProto3Message(
    Descriptor* message, const DescriptorProto& proto) {
  for (int i = 0; i < message->nested_type_count(); ++i) {
    ValidateProto3Message(message->nested_types_ + i,
                                 proto.nested_type(i));
  }
  for (int i = 0; i < message->enum_type_count(); ++i) {
    ValidateProto3Enum(message->enum_types_ + i,
                              proto.enum_type(i));
  }
  for (int i = 0; i < message->field_count(); ++i) {
    ValidateProto3Field(message->fields_ + i, proto.field(i));
  }
  for (int i = 0; i < message->extension_count(); ++i) {
    ValidateProto3Field(message->extensions_ +i, proto.extension(i));
  }
  if (message->extension_range_count() > 0) {
    AddError(message->full_name(), proto,
             DescriptorPool::ErrorCollector::OTHER,
             "Extension ranges are not allowed in proto3.");
  }
  if (message->options().message_set_wire_format()) {
    // Using MessageSet doesn't make sense since we disallow extensions.
    AddError(message->full_name(), proto,
             DescriptorPool::ErrorCollector::OTHER,
             "MessageSet is not supported in proto3.");
  }

  // In proto3, we reject field names if they conflict in camelCase.
  // Note that we currently enforce a stricter rule: Field names must be
  // unique after being converted to lowercase with underscores removed.
  std::map<string, const FieldDescriptor*> name_to_field;
  for (int i = 0; i < message->field_count(); ++i) {
    string lowercase_name = ToLowercaseWithoutUnderscores(
        message->field(i)->name());
    if (name_to_field.find(lowercase_name) != name_to_field.end()) {
      AddError(message->full_name(), proto,
               DescriptorPool::ErrorCollector::OTHER,
               "The JSON camel-case name of field \"" +
               message->field(i)->name() + "\" conflicts with field \"" +
               name_to_field[lowercase_name]->name() + "\". This is not " +
               "allowed in proto3.");
    } else {
      name_to_field[lowercase_name] = message->field(i);
    }
  }
}